

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall CompiledProjectOperator::~CompiledProjectOperator(CompiledProjectOperator *this)

{
  if (this->next_ != (BaseOperator *)0x0) {
    (*this->next_->_vptr_BaseOperator[1])();
  }
  std::__cxx11::string::~string((string *)&this->col_name_);
  return;
}

Assistant:

~CompiledProjectOperator() final {
        delete next_;
    }